

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID in_ESI;
  ImGuiWindow *in_RDI;
  bool bVar3;
  bool is_tab_stop;
  ImGuiContext *g;
  ImGuiKey in_stack_ffffffffffffffd4;
  int iVar4;
  
  pIVar1 = GImGui;
  bVar3 = ((in_RDI->DC).ItemFlags & 5U) == 0;
  (in_RDI->DC).FocusCounterRegular = (in_RDI->DC).FocusCounterRegular + 1;
  if (bVar3) {
    (in_RDI->DC).FocusCounterTabStop = (in_RDI->DC).FocusCounterTabStop + 1;
  }
  if ((((pIVar1->ActiveId == in_ESI) && ((pIVar1->FocusTabPressed & 1U) != 0)) &&
      (bVar2 = IsActiveIdUsingKey(in_stack_ffffffffffffffd4), !bVar2)) &&
     (pIVar1->FocusRequestNextWindow == (ImGuiWindow *)0x0)) {
    pIVar1->FocusRequestNextWindow = in_RDI;
    if (((pIVar1->IO).KeyShift & 1U) == 0) {
      iVar4 = 1;
    }
    else {
      iVar4 = 0;
      if (bVar3) {
        iVar4 = -1;
      }
    }
    pIVar1->FocusRequestNextCounterTabStop = (in_RDI->DC).FocusCounterTabStop + iVar4;
  }
  if (pIVar1->FocusRequestCurrWindow == in_RDI) {
    if ((in_RDI->DC).FocusCounterRegular == pIVar1->FocusRequestCurrCounterRegular) {
      return true;
    }
    if ((bVar3) && ((in_RDI->DC).FocusCounterTabStop == pIVar1->FocusRequestCurrCounterTabStop)) {
      pIVar1->NavJustTabbedId = in_ESI;
      return true;
    }
    if (pIVar1->ActiveId == in_ESI) {
      ClearActiveID();
    }
  }
  return false;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;

    // Increment counters
    const bool is_tab_stop = (window->DC.ItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->DC.FocusCounterRegular++;
    if (is_tab_stop)
        window->DC.FocusCounterTabStop++;

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.FocusTabPressed && !IsActiveIdUsingKey(ImGuiKey_Tab) && g.FocusRequestNextWindow == NULL)
    {
        g.FocusRequestNextWindow = window;
        g.FocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.FocusRequestCurrWindow == window)
    {
        if (window->DC.FocusCounterRegular == g.FocusRequestCurrCounterRegular)
            return true;
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.FocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id;
            return true;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }

    return false;
}